

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O1

void delete_all(int selected_only)

{
  Fl_Type *pFVar1;
  _func_int ***ppp_Var2;
  Fl_Type *pFVar3;
  Fl_Type *pFVar4;
  
  pFVar4 = Fl_Type::first;
  do {
    while( true ) {
      if (pFVar4 == (Fl_Type *)0x0) {
        if (selected_only == 0) {
          include_H_from_C = 1;
          use_FL_COMMAND = 0;
        }
        selection_changed((Fl_Type *)0x0);
        return;
      }
      pFVar1 = pFVar4;
      if ((selected_only == 0) || (pFVar4->selected != '\0')) break;
      pFVar4 = pFVar4->next;
    }
    do {
      pFVar3 = pFVar1;
      pFVar1 = pFVar3->next;
      if (pFVar1 == (Fl_Type *)0x0) break;
    } while (pFVar4->level < pFVar1->level);
    while (pFVar1 = pFVar3, pFVar1 != pFVar4) {
      pFVar3 = pFVar1->prev;
      if (pFVar1 != (Fl_Type *)0x0) {
        (*pFVar1->_vptr_Fl_Type[2])();
      }
    }
    ppp_Var2 = &pFVar4->_vptr_Fl_Type;
    pFVar4 = pFVar4->next;
    (*(*ppp_Var2)[2])();
  } while( true );
}

Assistant:

void delete_all(int selected_only) {
  for (Fl_Type *f = Fl_Type::first; f;) {
    if (f->selected || !selected_only) {
      delete_children(f);
      Fl_Type *g = f->next;
      delete f;
      f = g;
    } else f = f->next;
  }
  if(!selected_only) {
		include_H_from_C=1;
		use_FL_COMMAND=0;
	}

  selection_changed(0);
}